

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

int32_t tryConstMask(Expression *lhs,Expression *rhs)

{
  bool bVar1;
  uint uVar2;
  int32_t iVar3;
  Section *pSVar4;
  int32_t symbolOfs;
  int32_t unknownBits;
  Section *sect;
  Expression *expr;
  Symbol *sym;
  Expression *rhs_local;
  Expression *lhs_local;
  
  expr = (Expression *)rpn_SymbolOf(lhs);
  if ((((Symbol *)expr == (Symbol *)0x0) ||
      (pSVar4 = sym_GetSection((Symbol *)expr), sect = (Section *)rhs, pSVar4 == (Section *)0x0)) &&
     ((expr = (Expression *)rpn_SymbolOf(rhs), (Symbol *)expr == (Symbol *)0x0 ||
      (pSVar4 = sym_GetSection((Symbol *)expr), sect = (Section *)lhs, pSVar4 == (Section *)0x0))))
  {
    lhs_local._4_4_ = 0xffffffff;
  }
  else {
    bVar1 = sym_IsNumeric((Symbol *)expr);
    if (!bVar1) {
      __assert_fail("sym_IsNumeric(sym)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/rpn.cpp"
                    ,0x172,"tryConstMask");
    }
    bVar1 = rpn_isKnown((Expression *)sect);
    if (bVar1) {
      pSVar4 = sym_GetSection((Symbol *)expr);
      uVar2 = 0x10000 - (1 << (pSVar4->align & 0x1f));
      if ((*(uint *)&sect->name & uVar2) == 0) {
        if (pSVar4->org != 0xffffffff) {
          __assert_fail("sect->org == (uint32_t)-1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/rpn.cpp"
                        ,0x180,"tryConstMask");
        }
        iVar3 = sym_GetValue((Symbol *)expr);
        lhs_local._4_4_ = iVar3 + 1 + (uint)pSVar4->alignOfs & (uVar2 ^ 0xffffffff);
      }
      else {
        lhs_local._4_4_ = 0xffffffff;
      }
    }
    else {
      lhs_local._4_4_ = 0xffffffff;
    }
  }
  return lhs_local._4_4_;
}

Assistant:

static int32_t tryConstMask(struct Expression const *lhs, struct Expression const *rhs)
{
	struct Symbol const *sym = rpn_SymbolOf(lhs);
	struct Expression const *expr = rhs;

	if (!sym || !sym_GetSection(sym)) {
		// If the lhs isn't a symbol, try again the other way around
		sym = rpn_SymbolOf(rhs);
		expr = lhs;

		if (!sym || !sym_GetSection(sym))
			return -1;
	}
	assert(sym_IsNumeric(sym));

	if (!rpn_isKnown(expr))
		return -1;
	// We can now safely use `expr->val`
	struct Section const *sect = sym_GetSection(sym);
	int32_t unknownBits = (1 << 16) - (1 << sect->align); // The max alignment is 16

	// The mask must ignore all unknown bits
	if ((expr->val & unknownBits) != 0)
		return -1;

	// `sym_GetValue()` attempts to add the section's address,
	// but that's "-1" because the section is floating (otherwise we wouldn't be here)
	assert(sect->org == (uint32_t)-1);
	int32_t symbolOfs = sym_GetValue(sym) + 1;

	return (symbolOfs + sect->alignOfs) & ~unknownBits;
}